

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompressed_stream.cpp
# Opt level: O3

void __thiscall
minibag::UncompressedStream::decompress
          (UncompressedStream *this,uint8_t *dest,uint dest_len,uint8_t *source,uint source_len)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (source_len <= dest_len) {
    memcpy(dest,source,(ulong)source_len);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"dest_len not large enough","")
  ;
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_001506d8;
  __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void UncompressedStream::decompress(uint8_t* dest, unsigned int dest_len, uint8_t* source, unsigned int source_len) {
    if (dest_len < source_len)
        throw BagException("dest_len not large enough");

    memcpy(dest, source, source_len);
}